

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverCore.c
# Opt level: O1

int Msat_SolverSolve(Msat_Solver_t *p,Msat_IntVec_t *vAssumps,int nBackTrackLimit,int nTimeLimit)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  Msat_Type_t MVar4;
  int *piVar5;
  Msat_Clause_t *pMVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  timespec ts;
  Msat_SearchParams_t Params;
  long local_60;
  timespec local_58;
  Msat_SearchParams_t local_48;
  
  local_48.dVarDecay = 0.95;
  local_48.dClaDecay = 0.999;
  iVar2 = clock_gettime(3,&local_58);
  if (iVar2 < 0) {
    local_60 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    local_60 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  if (vAssumps != (Msat_IntVec_t *)0x0) {
    iVar2 = Msat_IntVecReadSize(p->vTrailLim);
    if (iVar2 != 0) {
      __assert_fail("Msat_IntVecReadSize(p->vTrailLim) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatSolverCore.c"
                    ,0x98,"int Msat_SolverSolve(Msat_Solver_t *, Msat_IntVec_t *, int, int)");
    }
    uVar3 = Msat_IntVecReadSize(vAssumps);
    piVar5 = Msat_IntVecReadArray(vAssumps);
    if (0 < (int)uVar3) {
      uVar8 = 0;
      do {
        iVar2 = Msat_SolverAssume(p,piVar5[uVar8]);
        if ((iVar2 == 0) || (pMVar6 = Msat_SolverPropagate(p), pMVar6 != (Msat_Clause_t *)0x0)) {
          Msat_QueueClear(p->pQueue);
          Msat_SolverCancelUntil(p,0);
          return -1;
        }
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
    }
  }
  iVar2 = Msat_SolverReadDecisionLevel(p);
  p->nLevelRoot = iVar2;
  iVar2 = Msat_ClauseVecReadSize(p->vClauses);
  p->nClausesInit = iVar2;
  iVar2 = Msat_ClauseVecReadSize(p->vClauses);
  dVar1 = (double)(iVar2 / 3);
  p->nBackTracks = (int)(p->Stats).nConflicts;
  dVar9 = 100.0;
  do {
    if (p->fVerbose != 0) {
      printf("Solving -- conflicts=%d   learnts=%d   progress=%.4f %%\n",
             SUB84(p->dProgress * 100.0,0),(ulong)(uint)(int)dVar9,(ulong)(uint)(int)dVar1);
    }
    MVar4 = Msat_SolverSearch(p,(int)dVar9,(int)dVar1,nBackTrackLimit,&local_48);
    dVar9 = dVar9 * 1.5;
    dVar1 = dVar1 * 1.1;
    if ((0 < nBackTrackLimit) && (nBackTrackLimit < (int)(p->Stats).nConflicts - p->nBackTracks))
    break;
    if (0 < nTimeLimit) {
      iVar2 = clock_gettime(3,&local_58);
      if (iVar2 < 0) {
        lVar7 = -1;
      }
      else {
        lVar7 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      if ((long)((ulong)(uint)nTimeLimit * 1000000) <= lVar7 + local_60) break;
    }
  } while (MVar4 == MSAT_UNKNOWN);
  Msat_SolverCancelUntil(p,0);
  p->nBackTracks = (int)(p->Stats).nConflicts - p->nBackTracks;
  return MVar4;
}

Assistant:

int  Msat_SolverSolve( Msat_Solver_t * p, Msat_IntVec_t * vAssumps, int nBackTrackLimit, int nTimeLimit )
{
    Msat_SearchParams_t Params = { 0.95, 0.999 };
    double nConflictsLimit, nLearnedLimit;
    Msat_Type_t Status;
    abctime timeStart = Abc_Clock();

//    p->pFreq = ABC_ALLOC( int, p->nVarsAlloc );
//    memset( p->pFreq, 0, sizeof(int) * p->nVarsAlloc );
 
    if ( vAssumps )
    {
        int * pAssumps, nAssumps, i;

        assert( Msat_IntVecReadSize(p->vTrailLim) == 0 );

        nAssumps = Msat_IntVecReadSize( vAssumps );
        pAssumps = Msat_IntVecReadArray( vAssumps );
        for ( i = 0; i < nAssumps; i++ )
        {
            if ( !Msat_SolverAssume(p, pAssumps[i]) || Msat_SolverPropagate(p) )
            {
                Msat_QueueClear( p->pQueue );
                Msat_SolverCancelUntil( p, 0 );
                return MSAT_FALSE;
            }
        }
    }
    p->nLevelRoot   = Msat_SolverReadDecisionLevel(p);
    p->nClausesInit = Msat_ClauseVecReadSize( p->vClauses );    
    nConflictsLimit = 100;
    nLearnedLimit   = Msat_ClauseVecReadSize(p->vClauses) / 3;
    Status = MSAT_UNKNOWN;
    p->nBackTracks = (int)p->Stats.nConflicts;
    while ( Status == MSAT_UNKNOWN )
    {
        if ( p->fVerbose )
            printf("Solving -- conflicts=%d   learnts=%d   progress=%.4f %%\n", 
                (int)nConflictsLimit, (int)nLearnedLimit, p->dProgress*100);
        Status = Msat_SolverSearch( p, (int)nConflictsLimit, (int)nLearnedLimit, nBackTrackLimit, &Params );
        nConflictsLimit *= 1.5;
        nLearnedLimit   *= 1.1;
        // if the limit on the number of backtracks is given, quit the restart loop
        if ( nBackTrackLimit > 0 && (int)p->Stats.nConflicts - p->nBackTracks > nBackTrackLimit )
            break;
        // if the runtime limit is exceeded, quit the restart loop
        if ( nTimeLimit > 0 && Abc_Clock() - timeStart >= nTimeLimit * CLOCKS_PER_SEC )
            break;
    }
    Msat_SolverCancelUntil( p, 0 );
    p->nBackTracks = (int)p->Stats.nConflicts - p->nBackTracks;
/*
    ABC_PRT( "True solver runtime", Abc_Clock() - timeStart );
    // print the statistics
    {
        int i, Counter = 0;
        for ( i = 0; i < p->nVars; i++ )
            if ( p->pFreq[i] > 0 )
            {
                printf( "%d ", p->pFreq[i] );
                Counter++;
            }
        if ( Counter )
            printf( "\n" );
        printf( "Total = %d. Used = %d.  Decisions = %d. Imps = %d. Conflicts = %d. ", p->nVars, Counter, (int)p->Stats.nDecisions, (int)p->Stats.nPropagations, (int)p->Stats.nConflicts );
        ABC_PRT( "Time", Abc_Clock() - timeStart );
    }
*/
    return Status;
}